

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp3::groebnerRow4_000_f
               (Matrix<double,_15,_18,_0,_15,_18> *groebnerMatrix,int targetRow)

{
  Scalar SVar1;
  Scalar *pSVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double factor;
  Index in_stack_ffffffffffffff58;
  DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *in_stack_ffffffffffffff60;
  DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *this;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x92f3d0);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1> *)*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92f3f1);
  dVar3 = (double)this / *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92f41e);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92f44c);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92f470);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar1;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *pSVar2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,auVar12,auVar20);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92f4c6);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92f4ea);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SVar1;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *pSVar2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar5,auVar13,auVar21);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92f540);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92f564);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SVar1;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *pSVar2;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar6,auVar14,auVar22);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92f5ba);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92f5de);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SVar1;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *pSVar2;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar7,auVar15,auVar23);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92f634);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92f658);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SVar1;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *pSVar2;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar8,auVar16,auVar24);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92f6ae);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92f6d2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SVar1;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *pSVar2;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar9,auVar17,auVar25);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92f728);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92f74c);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = SVar1;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *pSVar2;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar10,auVar18,auVar26);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92f7a5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_18,_0,_15,_18>,_1>::operator()
                     (this,in_stack_ffffffffffffff58,0x92f7cc);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = SVar1;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *pSVar2;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar11,auVar19,auVar27);
  *pSVar2 = auVar4._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp3::groebnerRow4_000_f( Eigen::Matrix<double,15,18> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,9) / groebnerMatrix(4,9);
  groebnerMatrix(targetRow,9) = 0.0;
  groebnerMatrix(targetRow,10) -= factor * groebnerMatrix(4,10);
  groebnerMatrix(targetRow,11) -= factor * groebnerMatrix(4,11);
  groebnerMatrix(targetRow,12) -= factor * groebnerMatrix(4,12);
  groebnerMatrix(targetRow,13) -= factor * groebnerMatrix(4,13);
  groebnerMatrix(targetRow,14) -= factor * groebnerMatrix(4,14);
  groebnerMatrix(targetRow,15) -= factor * groebnerMatrix(4,15);
  groebnerMatrix(targetRow,16) -= factor * groebnerMatrix(4,16);
  groebnerMatrix(targetRow,17) -= factor * groebnerMatrix(4,17);
}